

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

bool __thiscall nv::Image::load(Image *this,char *name)

{
  uint uVar1;
  Color32 *pCVar2;
  Format FVar3;
  Format FVar4;
  bool bVar5;
  AutoPtr<nv::Image> img;
  AutoPtr<nv::Image> local_18;
  
  free(this,name);
  local_18.m_ptr = ImageIO::load(name);
  if (local_18.m_ptr != (Image *)0x0) {
    uVar1 = this->m_width;
    this->m_width = (local_18.m_ptr)->m_width;
    (local_18.m_ptr)->m_width = uVar1;
    FVar3 = (local_18.m_ptr)->m_format;
    uVar1 = this->m_height;
    FVar4 = this->m_format;
    this->m_height = (local_18.m_ptr)->m_height;
    this->m_format = FVar3;
    (local_18.m_ptr)->m_height = uVar1;
    (local_18.m_ptr)->m_format = FVar4;
    pCVar2 = this->m_data;
    this->m_data = (local_18.m_ptr)->m_data;
    (local_18.m_ptr)->m_data = pCVar2;
  }
  bVar5 = local_18.m_ptr != (Image *)0x0;
  AutoPtr<nv::Image>::~AutoPtr(&local_18);
  return bVar5;
}

Assistant:

bool Image::load(const char * name)
{
	free();
	
	AutoPtr<Image> img(ImageIO::load(name));
	if (img == NULL) {
		return false;
	}
	
	swap(m_width, img->m_width);
	swap(m_height, img->m_height);
	swap(m_format, img->m_format);
	swap(m_data, img->m_data);
	
	return true;
}